

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qwidgetwindow.cpp
# Opt level: O2

void __thiscall QWidgetWindow::handleResizeEvent(QWidgetWindow *this,QResizeEvent *event)

{
  Data *pDVar1;
  bool bVar2;
  QObject *pQVar3;
  long in_FS_OFFSET;
  QRegion dirtyRegion;
  QRect local_40;
  QRegion local_30;
  undefined1 local_28 [16];
  long local_18;
  
  local_18 = *(long *)(in_FS_OFFSET + 0x28);
  local_28._8_8_ = &DAT_aaaaaaaaaaaaaaaa;
  local_28._0_8_ = &DAT_aaaaaaaaaaaaaaaa;
  local_28 = (undefined1  [16])QWidget::rect((QWidget *)(this->m_widget).wp.value);
  bVar2 = updateSize(this);
  if (bVar2) {
    pDVar1 = (this->m_widget).wp.d;
    if ((pDVar1 == (Data *)0x0) || (*(int *)(pDVar1 + 4) == 0)) {
      pQVar3 = (QObject *)0x0;
    }
    else {
      pQVar3 = (this->m_widget).wp.value;
    }
    QCoreApplication::forwardEvent(pQVar3,(QEvent *)event,(QEvent *)0x0);
    bVar2 = QWidgetPrivate::shouldPaintOnScreen(*(QWidgetPrivate **)((this->m_widget).wp.value + 8))
    ;
    if (!bVar2) {
      if (*(long *)(in_FS_OFFSET + 0x28) == local_18) {
        QWidgetPrivate::syncBackingStore(*(QWidgetPrivate **)((this->m_widget).wp.value + 8));
        return;
      }
      goto LAB_00314966;
    }
    local_30.d = (QRegionData *)&DAT_aaaaaaaaaaaaaaaa;
    local_40 = QWidget::rect((QWidget *)(this->m_widget).wp.value);
    QRegion::QRegion(&local_30,&local_40,Rectangle);
    pQVar3 = (this->m_widget).wp.value;
    if ((*(byte *)(*(long *)(pQVar3 + 0x20) + 8) & 0x20) != 0) {
      QRegion::QRegion((QRegion *)&local_40,(QRect *)local_28,Rectangle);
      QRegion::operator-=(&local_30,(QRegion *)&local_40);
      QRegion::~QRegion((QRegion *)&local_40);
      pQVar3 = (this->m_widget).wp.value;
    }
    QWidgetPrivate::syncBackingStore(*(QWidgetPrivate **)(pQVar3 + 8),&local_30);
    QRegion::~QRegion(&local_30);
  }
  if (*(long *)(in_FS_OFFSET + 0x28) == local_18) {
    return;
  }
LAB_00314966:
  __stack_chk_fail();
}

Assistant:

void QWidgetWindow::handleResizeEvent(QResizeEvent *event)
{
    auto oldRect = m_widget->rect();

    if (updateSize()) {
        QGuiApplication::forwardEvent(m_widget, event);

        if (m_widget->d_func()->shouldPaintOnScreen()) {
            QRegion dirtyRegion = m_widget->rect();
            if (m_widget->testAttribute(Qt::WA_StaticContents))
                dirtyRegion -= oldRect;
            m_widget->d_func()->syncBackingStore(dirtyRegion);
        } else {
            m_widget->d_func()->syncBackingStore();
        }
    }
}